

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O0

void do_newbie(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var5;
  CHAR_DATA *wch;
  char buf2 [4608];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffdb98;
  CHAR_DATA *in_stack_ffffffffffffdba8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffdbb0;
  CHAR_DATA *in_stack_ffffffffffffdbb8;
  CHAR_DATA *local_2420;
  CHAR_DATA local_2418 [5];
  char local_1218 [4616];
  char *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (((*(short *)(in_RDI + 0x138) < 0x1a) ||
      (bVar2 = is_immortal(in_stack_ffffffffffffdb98), bVar2)) ||
     (uVar1 = *(ulong *)(local_8 + 0x180), _Var5 = std::pow<int,int>(0,0x52446f),
     (uVar1 & (long)_Var5) != 0)) {
    if (*local_10 == '\0') {
      uVar1 = *(ulong *)(local_8 + 400);
      _Var5 = std::pow<int,int>(0,0x5244d2);
      if ((uVar1 & (long)_Var5) == 0) {
        send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        _Var5 = std::pow<int,int>(0,0x52454c);
        *(ulong *)(local_8 + 400) = (long)_Var5 | *(ulong *)(local_8 + 400);
      }
      else {
        send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
        _Var5 = std::pow<int,int>(0,0x524508);
        *(ulong *)(local_8 + 400) = ((long)_Var5 ^ 0xffffffffffffffffU) & *(ulong *)(local_8 + 400);
      }
    }
    else if (*local_10 == '\0') {
      send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
    }
    else {
      sprintf(local_1218,": %s",local_10);
      _Var5 = std::pow<int,int>(0,0x5245c4);
      *(ulong *)(local_8 + 400) = ((long)_Var5 ^ 0xffffffffffffffffU) & *(ulong *)(local_8 + 400);
      uVar1 = *(ulong *)(local_8 + 400);
      _Var5 = std::pow<int,int>(0,0x524606);
      if ((uVar1 & (long)_Var5) == 0) {
        act_new((char *)buf2._160_8_,(CHAR_DATA *)buf2._152_8_,(void *)buf2._144_8_,
                (void *)buf2._136_8_,buf2._132_4_,buf2._128_4_);
      }
      else {
        in_stack_ffffffffffffdbb8 = local_2418;
        pcVar3 = get_char_color(in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
        pcVar4 = END_COLOR(in_stack_ffffffffffffdba8);
        sprintf((char *)in_stack_ffffffffffffdbb8,"%s[NEWBIE] $n$t%s",pcVar3,pcVar4);
        act_new((char *)buf2._160_8_,(CHAR_DATA *)buf2._152_8_,(void *)buf2._144_8_,
                (void *)buf2._136_8_,buf2._132_4_,buf2._128_4_);
      }
      for (local_2420 = char_list; local_2420 != (CHAR_DATA *)0x0; local_2420 = local_2420->next) {
        bVar2 = is_npc(in_stack_ffffffffffffdb98);
        if ((!bVar2) || (local_2420->desc != (DESCRIPTOR_DATA *)0x0)) {
          if (local_2420->level < 0x1a) {
            in_stack_ffffffffffffdbb0 = (char *)local_2420->comm[0];
            _Var5 = std::pow<int,int>(0,0x524726);
            if (((ulong)in_stack_ffffffffffffdbb0 & (long)_Var5) != 0) goto LAB_00524739;
          }
          else {
LAB_00524739:
            bVar2 = is_immortal(in_stack_ffffffffffffdb98);
            if (((!bVar2) && (bVar2 = is_heroimm(in_stack_ffffffffffffdb98), !bVar2)) &&
               ((bVar2 = is_npc(in_stack_ffffffffffffdb98), !bVar2 ||
                ((local_2420->desc == (DESCRIPTOR_DATA *)0x0 ||
                 (bVar2 = is_immortal(in_stack_ffffffffffffdb98), !bVar2)))))) goto LAB_00524867;
          }
          ch_00 = (CHAR_DATA *)local_2420->comm[0];
          _Var5 = std::pow<int,int>(0,0x5247b9);
          if (((ulong)ch_00 & (long)_Var5) == 0) {
            act_new((char *)buf2._160_8_,(CHAR_DATA *)buf2._152_8_,(void *)buf2._144_8_,
                    (void *)buf2._136_8_,buf2._132_4_,buf2._128_4_);
          }
          else {
            in_stack_ffffffffffffdb98 = local_2418;
            pcVar3 = get_char_color(in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
            pcVar4 = END_COLOR(ch_00);
            sprintf((char *)in_stack_ffffffffffffdb98,"%s[NEWBIE] $n$t%s",pcVar3,pcVar4);
            act_new((char *)buf2._160_8_,(CHAR_DATA *)buf2._152_8_,(void *)buf2._144_8_,
                    (void *)buf2._136_8_,buf2._132_4_,buf2._128_4_);
          }
        }
LAB_00524867:
      }
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffdbb0,in_stack_ffffffffffffdba8);
  }
  return;
}

Assistant:

void do_newbie(CHAR_DATA *ch, char *argument)
{
	if (ch->level > 25 && !is_immortal(ch) && !IS_SET(ch->act, PLR_HEROIMM))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}
	else
	{
		if (argument[0] == '\0')
		{
			if (IS_SET(ch->comm, COMM_NONEWBIE))
			{
				send_to_char("Newbie channel is now ON\n\r", ch);
				REMOVE_BIT(ch->comm, COMM_NONEWBIE);
			}
			else
			{
				send_to_char("Newbie channel is now OFF\n\r", ch);
				SET_BIT(ch->comm, COMM_NONEWBIE);
			}

			return;
		}
	}

	if (argument[0] == '\0')
	{
		send_to_char("Syntax: newbie <message>\n\r", ch);
		return;
	}

	char buf[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH];
	sprintf(buf, ": %s", argument);

	REMOVE_BIT(ch->comm, COMM_NONEWBIE);

	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf2, "%s[NEWBIE] $n$t%s", get_char_color(ch, "newbie"), END_COLOR(ch));
		act_new(buf2, ch, buf, 0, TO_CHAR, POS_DEAD);
	}
	else
	{
		act_new("[NEWBIE] $n$t", ch, buf, 0, TO_CHAR, POS_DEAD);
	}

	for (auto wch = char_list; wch != nullptr; wch = wch->next)
	{
		if (is_npc(wch) && wch->desc == nullptr)
			continue;

		if ((wch->level <= 25 && !IS_SET(wch->comm, COMM_NONEWBIE)) || is_immortal(wch) || is_heroimm(wch) || (is_npc(wch) && (wch->desc != nullptr) && is_immortal(wch->desc->original)))
		{
			if (IS_SET(wch->comm, COMM_ANSI))
			{
				sprintf(buf2, "%s[NEWBIE] $n$t%s", get_char_color(wch, "newbie"), END_COLOR(wch));
				act_new(buf2, ch, buf, wch, TO_VICT, POS_DEAD);
			}
			else
				act_new("[NEWBIE] $n$t", ch, buf, wch, TO_VICT, POS_DEAD);
		}
	}
}